

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

index_t __thiscall filtered_union_find::find(filtered_union_find *this,index_t x)

{
  reference pvVar1;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  index_t z;
  index_t y;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
  local_14 = *pvVar1;
  local_10 = in_ESI;
  while (local_14 != local_10) {
    local_10 = local_14;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_14);
    local_14 = *pvVar1;
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)in_ESI);
  local_10 = *pvVar1;
  local_c = in_ESI;
  while (local_14 != local_10) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_c);
    *pvVar1 = local_14;
    local_c = local_10;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_10);
    local_10 = *pvVar1;
  }
  return local_14;
}

Assistant:

index_t find(index_t x) {
		index_t y = x, z = parent[y];
		while (z != y) {
			y = z;
			z = parent[y];
		}
		y = parent[x];
		while (z != y) {
			parent[x] = z;
			x = y;
			y = parent[x];
		}
		return z;
	}